

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O2

void __thiscall capnp::_::BuilderArena::BuilderArena(BuilderArena *this,MessageBuilder *message)

{
  (this->super_Arena)._vptr_Arena = (_func_int **)&PTR__BuilderArena_0066a2e0;
  this->message = message;
  (this->dummyLimiter).limit = 0xffffffffffffffff;
  (this->localCapTable).super_CapTableBuilder.super_CapTableReader._vptr_CapTableReader =
       (_func_int **)&PTR_extractCap_0066a398;
  (this->localCapTable).capTable.builder.ptr =
       (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0;
  (this->localCapTable).capTable.builder.pos =
       (RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)0x0;
  (this->localCapTable).capTable.builder.endPtr =
       (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0;
  (this->localCapTable).capTable.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (this->segment0).super_SegmentReader.arena = (Arena *)0x0;
  (this->segment0).super_SegmentReader.id.value = 0;
  (this->segment0).super_SegmentReader.ptr.ptr = (word *)0x0;
  (this->segment0).super_SegmentReader.ptr.size_ = 0;
  (this->segment0).super_SegmentReader.readLimiter = (ReadLimiter *)0x0;
  (this->segment0).pos = (word *)0x0;
  (this->segment0).readOnly = false;
  (this->segment0ForOutput).ptr = (word *)0x0;
  (this->segment0ForOutput).size_ = 0;
  (this->moreSegments).ptr.disposer = (Disposer *)0x0;
  (this->moreSegments).ptr.ptr = (MultiSegmentState *)0x0;
  this->segmentWithSpace = (SegmentBuilder *)0x0;
  return;
}

Assistant:

BuilderArena::BuilderArena(MessageBuilder* message)
    : message(message), segment0(nullptr, SegmentId(0), nullptr, nullptr) {}